

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox.cpp
# Opt level: O2

void __thiscall CMU462::BBox::draw(BBox *this,Color c)

{
  glColor4f(c._0_8_,CONCAT44(c.g,c.g),c._8_8_,c.a);
  glBegin(3);
  glVertex3d((this->max).x,(this->max).y,(this->max).z);
  glVertex3d((this->max).x,(this->max).y,(this->min).z);
  glVertex3d((this->min).x,(this->max).y,(this->min).z);
  glVertex3d((this->min).x,(this->max).y,(this->max).z);
  glVertex3d((this->max).x,(this->max).y,(this->max).z);
  glEnd();
  glBegin(3);
  glVertex3d((this->min).x,(this->min).y,(this->min).z);
  glVertex3d((this->min).x,(this->min).y,(this->max).z);
  glVertex3d((this->max).x,(this->min).y,(this->max).z);
  glVertex3d((this->max).x,(this->min).y,(this->min).z);
  glVertex3d((this->min).x,(this->min).y,(this->min).z);
  glEnd();
  glBegin(1);
  glVertex3d((this->max).x,(this->max).y,(this->max).z);
  glVertex3d((this->max).x,(this->min).y,(this->max).z);
  glVertex3d((this->max).x,(this->max).y,(this->min).z);
  glVertex3d((this->max).x,(this->min).y,(this->min).z);
  glVertex3d((this->min).x,(this->max).y,(this->min).z);
  glVertex3d((this->min).x,(this->min).y,(this->min).z);
  glVertex3d((this->min).x,(this->max).y,(this->max).z);
  glVertex3d((this->min).x,(this->min).y,(this->max).z);
  glEnd();
  return;
}

Assistant:

void BBox::draw(Color c) const {

    glColor4f(c.r, c.g, c.b, c.a);

    // top
    glBegin(GL_LINE_STRIP);
    glVertex3d(max.x, max.y, max.z);
    glVertex3d(max.x, max.y, min.z);
    glVertex3d(min.x, max.y, min.z);
    glVertex3d(min.x, max.y, max.z);
    glVertex3d(max.x, max.y, max.z);
    glEnd();

    // bottom
    glBegin(GL_LINE_STRIP);
    glVertex3d(min.x, min.y, min.z);
    glVertex3d(min.x, min.y, max.z);
    glVertex3d(max.x, min.y, max.z);
    glVertex3d(max.x, min.y, min.z);
    glVertex3d(min.x, min.y, min.z);
    glEnd();

    // side
    glBegin(GL_LINES);
    glVertex3d(max.x, max.y, max.z);
    glVertex3d(max.x, min.y, max.z);
    glVertex3d(max.x, max.y, min.z);
    glVertex3d(max.x, min.y, min.z);
    glVertex3d(min.x, max.y, min.z);
    glVertex3d(min.x, min.y, min.z);
    glVertex3d(min.x, max.y, max.z);
    glVertex3d(min.x, min.y, max.z);
    glEnd();

  }